

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS ref_facelift_import(REF_GRID ref_grid,char *filename)

{
  REF_GEOM ref_geom_recipient;
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_GEOM ref_geom;
  REF_FACELIFT ref_facelift;
  REF_GRID freeable_ref_grid;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  freeable_ref_grid = (REF_GRID)filename;
  filename_local = (char *)ref_grid;
  uVar1 = ref_import_by_extension((REF_GRID *)&ref_facelift,ref_grid->mpi,filename);
  if (uVar1 == 0) {
    ref_geom_recipient = (REF_GEOM)ref_facelift[2].edge_search;
    uVar1 = ref_geom_share_context(ref_geom_recipient,*(REF_GEOM *)(filename_local + 0x98));
    if (uVar1 == 0) {
      if (ref_geom_recipient->model != (void *)0x0) {
        uVar1 = ref_egads_mark_jump_degen((REF_GRID)ref_facelift);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x1e2,"ref_facelift_import",(ulong)uVar1,"T and UV jumps; UV degen");
          return uVar1;
        }
        uVar1 = ref_geom_verify_topo((REF_GRID)ref_facelift);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x1e3,"ref_facelift_import",(ulong)uVar1,"geom topo");
          return uVar1;
        }
        uVar1 = ref_geom_verify_param((REF_GRID)ref_facelift);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x1e4,"ref_facelift_import",(ulong)uVar1,"geom param");
          return uVar1;
        }
      }
      uVar1 = ref_facelift_create((REF_FACELIFT *)&ref_geom,(REF_GRID)ref_facelift,0);
      if (uVar1 == 0) {
        *(REF_GEOM *)(*(long *)(filename_local + 0x98) + 0xe8) = ref_geom;
        ref_grid_local._4_4_ = ref_facelift_infer_displacement((REF_FACELIFT)ref_geom);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x1e9,"ref_facelift_import",(ulong)ref_grid_local._4_4_,"infer displacement");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x1e7,"ref_facelift_import",(ulong)uVar1,"create");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x1df,"ref_facelift_import",(ulong)uVar1,"share context");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x1dc,"ref_facelift_import",(ulong)uVar1,"import");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_import(REF_GRID ref_grid,
                                       const char *filename) {
  REF_GRID freeable_ref_grid;
  REF_FACELIFT ref_facelift;
  REF_GEOM ref_geom;
  RSS(ref_import_by_extension(&freeable_ref_grid, ref_grid_mpi(ref_grid),
                              filename),
      "import");
  ref_geom = ref_grid_geom(freeable_ref_grid);
  RSS(ref_geom_share_context(ref_geom, ref_grid_geom(ref_grid)),
      "share context");
  if (ref_geom_model_loaded(ref_geom)) {
    RSS(ref_egads_mark_jump_degen(freeable_ref_grid),
        "T and UV jumps; UV degen");
    RSS(ref_geom_verify_topo(freeable_ref_grid), "geom topo");
    RSS(ref_geom_verify_param(freeable_ref_grid), "geom param");
  }
  RSS(ref_facelift_create(&ref_facelift, freeable_ref_grid, REF_FALSE),
      "create");
  ref_geom_facelift(ref_grid_geom(ref_grid)) = ref_facelift;
  RSS(ref_facelift_infer_displacement(ref_facelift), "infer displacement");
  return REF_SUCCESS;
}